

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall
ON_PlaneSurface::CreatePlaneThroughBox
          (ON_PlaneSurface *this,ON_Plane *plane,ON_BoundingBox *bbox,double padding)

{
  double dVar1;
  ON_3dPoint p;
  ON_Interval extents;
  ON_Interval extents_00;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  undefined1 auStack_c8 [8];
  ON_3dPoint pt;
  undefined1 local_a0 [8];
  ON_Line edge;
  double dStack_68;
  int i;
  double v;
  double u;
  double t;
  ON_Interval vext;
  ON_Interval uext;
  double padding_local;
  ON_BoundingBox *bbox_local;
  ON_Plane *plane_local;
  ON_PlaneSurface *this_local;
  
  bVar3 = ON_Plane::IsValid(plane);
  if ((bVar3) && (bVar3 = ON_BoundingBox::IsValid(bbox), bVar3)) {
    ON_Interval::ON_Interval((ON_Interval *)(vext.m_t + 1),ON_DBL_PINF,ON_DBL_NINF);
    ON_Interval::ON_Interval((ON_Interval *)&t,ON_DBL_PINF,ON_DBL_NINF);
    for (edge.to.z._4_4_ = 0; (int)edge.to.z._4_4_ < 0xc; edge.to.z._4_4_ = edge.to.z._4_4_ + 1) {
      ON_BoundingBox::Edge((ON_Line *)local_a0,bbox,edge.to.z._4_4_);
      bVar3 = ON_Intersect((ON_Line *)local_a0,&plane->plane_equation,&u);
      if (bVar3) {
        if ((u < 0.0) || (1.0 < u)) {
          pt.z._0_4_ = 4;
        }
        else {
          ON_Line::PointAt((ON_3dPoint *)auStack_c8,(ON_Line *)local_a0,u);
          p.y = pt.x;
          p.x = (double)auStack_c8;
          p.z = pt.y;
          ON_Plane::ClosestPointTo(plane,p,&v,&stack0xffffffffffffff98);
          dVar1 = v;
          pdVar4 = ON_Interval::operator[]((ON_Interval *)(vext.m_t + 1),0);
          dVar2 = v;
          if (dVar1 < *pdVar4) {
            pdVar4 = ON_Interval::operator[]((ON_Interval *)(vext.m_t + 1),0);
            *pdVar4 = dVar2;
          }
          dVar1 = v;
          pdVar4 = ON_Interval::operator[]((ON_Interval *)(vext.m_t + 1),1);
          dVar2 = v;
          if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) {
            pdVar4 = ON_Interval::operator[]((ON_Interval *)(vext.m_t + 1),1);
            *pdVar4 = dVar2;
          }
          dVar1 = dStack_68;
          pdVar4 = ON_Interval::operator[]((ON_Interval *)&t,0);
          dVar2 = dStack_68;
          if (dVar1 < *pdVar4) {
            pdVar4 = ON_Interval::operator[]((ON_Interval *)&t,0);
            *pdVar4 = dVar2;
          }
          dVar1 = dStack_68;
          pdVar4 = ON_Interval::operator[]((ON_Interval *)&t,1);
          dVar2 = dStack_68;
          if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) {
            pdVar4 = ON_Interval::operator[]((ON_Interval *)&t,1);
            *pdVar4 = dVar2;
          }
          pt.z._0_4_ = 0;
        }
      }
      else {
        pt.z._0_4_ = 4;
      }
      ON_Line::~ON_Line((ON_Line *)local_a0);
    }
    operator=(this,plane);
    dVar1 = ON_Interval::Length((ON_Interval *)(vext.m_t + 1));
    ON_Interval::Expand((ON_Interval *)(vext.m_t + 1),padding * dVar1 + padding);
    dVar1 = ON_Interval::Length((ON_Interval *)&t);
    ON_Interval::Expand((ON_Interval *)&t,padding * dVar1 + padding);
    extents_00.m_t[1] = uext.m_t[0];
    extents_00.m_t[0] = vext.m_t[1];
    SetExtents(this,0,extents_00,true);
    extents.m_t[1] = vext.m_t[0];
    extents.m_t[0] = t;
    SetExtents(this,1,extents,true);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PlaneSurface::CreatePlaneThroughBox(
  const ON_Plane& plane,
  const ON_BoundingBox& bbox,
  double padding
)
{
  if (!plane.IsValid() || !bbox.IsValid())
    return false;

  ON_Interval uext(ON_DBL_PINF, ON_DBL_NINF);
  ON_Interval vext(ON_DBL_PINF, ON_DBL_NINF);
  double t, u, v;
  for (int i = 0; i < 12; i++)
  {
    ON_Line edge = bbox.Edge(i);
    if (!ON_Intersect(edge, plane.plane_equation, &t)) continue;
    if (t < 0.0 || t > 1.0) continue;
    ON_3dPoint pt = edge.PointAt(t);
    plane.ClosestPointTo(pt, &u, &v);
    if (u < uext[0]) uext[0] = u;
    if (u > uext[1]) uext[1] = u;
    if (v < vext[0]) vext[0] = v;
    if (v > vext[1]) vext[1] = v;
  }
  *this = plane;
  uext.Expand(padding * uext.Length() + padding);
  vext.Expand(padding * vext.Length() + padding);
  SetExtents(0, uext, true);
  SetExtents(1, vext, true);
  return true;
}